

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

void libssh2_sftp_dtor(LIBSSH2_SESSION *session,void **session_abstract,LIBSSH2_CHANNEL *channel,
                      void **channel_abstract)

{
  void *pvVar1;
  LIBSSH2_SFTP *sftp;
  void **channel_abstract_local;
  LIBSSH2_CHANNEL *channel_local;
  void **session_abstract_local;
  LIBSSH2_SESSION *session_local;
  
  pvVar1 = *channel_abstract;
  if (*(long *)((long)pvVar1 + 0x58) != 0) {
    (*session->free)(*(void **)((long)pvVar1 + 0x58),&session->abstract);
  }
  if (*(long *)((long)pvVar1 + 0xc0) != 0) {
    (*session->free)(*(void **)((long)pvVar1 + 0xc0),&session->abstract);
  }
  (*session->free)(pvVar1,&session->abstract);
  return;
}

Assistant:

LIBSSH2_CHANNEL_CLOSE_FUNC(libssh2_sftp_dtor)
{
    LIBSSH2_SFTP *sftp = (LIBSSH2_SFTP *) (*channel_abstract);

    (void)session_abstract;
    (void)channel;

    /* Free the partial packet storage for sftp_packet_read */
    if(sftp->partial_packet) {
        LIBSSH2_FREE(session, sftp->partial_packet);
    }

    /* Free the packet storage for _libssh2_sftp_packet_readdir */
    if(sftp->readdir_packet) {
        LIBSSH2_FREE(session, sftp->readdir_packet);
    }

    LIBSSH2_FREE(session, sftp);
}